

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_connect_nonblocking
                   (Curl_easy *data,connectdata *conn,_Bool isproxy,int sockindex,_Bool *done)

{
  _Bool _Var1;
  CURLcode CVar2;
  undefined1 *puVar3;
  
  if (((conn->bits).proxy_ssl_connected[sockindex] == true) &&
     (CVar2 = ssl_connect_init_proxy(conn,sockindex), CVar2 != CURLE_OK)) {
    return CVar2;
  }
  _Var1 = ssl_prefs_check(data);
  if (_Var1) {
    puVar3 = &conn->ssl[sockindex].field_0x10;
    *puVar3 = *puVar3 | 1;
    CVar2 = (*Curl_ssl->connect_nonblocking)(data,conn,sockindex,done);
    if (CVar2 == CURLE_OK) {
      CVar2 = CURLE_OK;
      if (*done == true && !isproxy) {
        Curl_pgrsTime(data,TIMER_APPCONNECT);
      }
    }
    else {
      puVar3 = &conn->ssl[sockindex].field_0x10;
      *puVar3 = *puVar3 & 0xfe;
    }
  }
  else {
    CVar2 = CURLE_SSL_CONNECT_ERROR;
  }
  return CVar2;
}

Assistant:

CURLcode
Curl_ssl_connect_nonblocking(struct Curl_easy *data, struct connectdata *conn,
                             bool isproxy, int sockindex, bool *done)
{
  CURLcode result;

#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy_ssl_connected[sockindex]) {
    result = ssl_connect_init_proxy(conn, sockindex);
    if(result)
      return result;
  }
#endif
  if(!ssl_prefs_check(data))
    return CURLE_SSL_CONNECT_ERROR;

  /* mark this is being ssl requested from here on. */
  conn->ssl[sockindex].use = TRUE;
  result = Curl_ssl->connect_nonblocking(data, conn, sockindex, done);
  if(result)
    conn->ssl[sockindex].use = FALSE;
  else if(*done && !isproxy)
    Curl_pgrsTime(data, TIMER_APPCONNECT); /* SSL is connected */
  return result;
}